

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_example.cxx
# Opt level: O2

void test_basic_usage<ThreadSafeDerived>(void)

{
  TPtr TVar1;
  bool bVar2;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  TPtr ptr2;
  TPtr pt3;
  Result local_a0;
  __atomic_base<long> local_90;
  TPtr ptr;
  ResultBuilder _DOCTEST_RB;
  __atomic_base<long> local_40;
  undefined4 local_34;
  
  ptr.ptr = (pointer)operator_new(8);
  instance_counted<ThreadSafeBase>::numInstances =
       instance_counted<ThreadSafeBase>::numInstances + 1;
  ((ptr.ptr)->super_ThreadSafeBase).super_atomic_reference_count<ThreadSafeBase>.count.
  super___atomic_base<long>._M_i = 1;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x23,"T::numInstances == 1","");
    ptr2.ptr = (pointer)&instance_counted<ThreadSafeBase>::numInstances;
    pt3.ptr._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr2);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x24,"ptr.use_count() == 1","");
    if (ptr.ptr == (pointer)0x0) {
      pt3.ptr = (pointer)0x0;
    }
    else {
      pt3.ptr = (pointer)((ptr.ptr)->super_ThreadSafeBase).
                         super_atomic_reference_count<ThreadSafeBase>.count.
                         super___atomic_base<long>._M_i;
    }
    local_90._M_i._0_4_ = 1;
    ptr2.ptr = (pointer)&pt3;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr2);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_00);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  ptr2 = ptr;
  if (ptr.ptr != (pointer)0x0) {
    LOCK();
    ((ptr.ptr)->super_ThreadSafeBase).super_atomic_reference_count<ThreadSafeBase>.count.
    super___atomic_base<long>._M_i =
         ((ptr.ptr)->super_ThreadSafeBase).super_atomic_reference_count<ThreadSafeBase>.count.
         super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x27,"T::numInstances == 1","");
    pt3.ptr = (pointer)&instance_counted<ThreadSafeBase>::numInstances;
    local_90._M_i._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&pt3);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_01);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x28,"ptr.use_count() == 2","");
    if (ptr.ptr == (pointer)0x0) {
      local_90._M_i = 0;
    }
    else {
      local_90._M_i =
           ((ptr.ptr)->super_ThreadSafeBase).super_atomic_reference_count<ThreadSafeBase>.count.
           super___atomic_base<long>._M_i;
    }
    local_40._M_i._0_4_ = 2;
    pt3.ptr = (pointer)&local_90;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&pt3);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_02);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
    TVar1 = ptr2;
  } while (bVar2);
  ptr2.ptr = (pointer)0x0;
  pt3 = TVar1;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2a,"T::numInstances == 1","");
    local_90._M_i = (__int_type)&instance_counted<ThreadSafeBase>::numInstances;
    local_40._M_i._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&local_90);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_03);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2b,"ptr.use_count() == 2","");
    if (ptr.ptr == (pointer)0x0) {
      local_40._M_i = 0;
    }
    else {
      local_40._M_i =
           ((ptr.ptr)->super_ThreadSafeBase).super_atomic_reference_count<ThreadSafeBase>.count.
           super___atomic_base<long>._M_i;
    }
    local_34 = 2;
    local_90._M_i = (__int_type)&local_40;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&local_90);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_04);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::~retain_ptr(&pt3);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::~retain_ptr(&ptr2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2d,"T::numInstances == 1","");
    ptr2.ptr = (pointer)&instance_counted<ThreadSafeBase>::numInstances;
    pt3.ptr._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr2);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_05);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2e,"ptr.use_count() == 1","");
    if (ptr.ptr == (pointer)0x0) {
      pt3.ptr = (pointer)0x0;
    }
    else {
      pt3.ptr = (pointer)((ptr.ptr)->super_ThreadSafeBase).
                         super_atomic_reference_count<ThreadSafeBase>.count.
                         super___atomic_base<long>._M_i;
    }
    ptr2.ptr = (pointer)&pt3;
    local_90._M_i._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr2);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_06);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::~retain_ptr(&ptr);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x30,"T::numInstances == 0","");
    ptr.ptr = (pointer)&instance_counted<ThreadSafeBase>::numInstances;
    ptr2.ptr = (pointer)((ulong)ptr2.ptr & 0xffffffff00000000);
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_07);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  return;
}

Assistant:

void test_basic_usage()
{
  using TPtr = sg14::retain_ptr<T>;
  {
    TPtr ptr{new T};
    REQUIRE(T::numInstances == 1);
    REQUIRE(ptr.use_count() == 1);
    {
      TPtr ptr2{ptr};
      REQUIRE(T::numInstances == 1);
      REQUIRE(ptr.use_count() == 2);
      TPtr pt3{std::move(ptr2)};
      REQUIRE(T::numInstances == 1);
      REQUIRE(ptr.use_count() == 2);
    }
    REQUIRE(T::numInstances == 1);
    REQUIRE(ptr.use_count() == 1);
  }
  REQUIRE(T::numInstances == 0);
}